

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O3

int __thiscall SkipList::randomHeight(SkipList *this)

{
  long lVar1;
  result_type_conflict rVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long *in_FS_OFFSET;
  param_type local_13c0;
  random_device local_13b8;
  
  srand(10000);
  lVar1 = *in_FS_OFFSET;
  iVar5 = 0;
  while( true ) {
    local_13c0._M_a = 0;
    local_13c0._M_b = 10000;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      std::random_device::random_device(&local_13b8);
      uVar3 = std::random_device::_M_getval();
      uVar4 = uVar3 / 0x7fffffff << 0x1f | uVar3 / 0x7fffffff;
      in_FS_OFFSET[-2] = (ulong)(uVar4 + uVar3 + (uint)(uVar3 + uVar4 == 0));
      std::random_device::_M_fini();
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_13c0,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       (lVar1 + -0x10),&local_13c0);
    if ((4999 < rVar2) || (this->MAX_HEIGHT <= iVar5)) break;
    iVar5 = iVar5 + 1;
  }
  return iVar5;
}

Assistant:

int SkipList::randomHeight() {
    int rand_height = 0;
    std::srand(10000);
    while (std::experimental::randint(0, 10000) < 5000 && rand_height < MAX_HEIGHT) {
        ++rand_height;
    }
    return rand_height;
}